

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Value value_from_text_part_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  Am_Value local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object owner;
  Am_Object *self_local;
  Am_Value *value;
  
  Am_Value::Am_Value((Am_Value *)self);
  if ((value_from_text_part_proc(Am_Object&)::val == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_from_text_part_proc(Am_Object&)::val), iVar2 != 0)) {
    Am_String::Am_String(&value_from_text_part_proc::val,"",true);
    __cxa_atexit(Am_String::~Am_String,&value_from_text_part_proc::val,&__dso_handle);
    __cxa_guard_release(&value_from_text_part_proc(Am_Object&)::val);
  }
  Am_Object::Get_Owner(&local_38,in_RSI);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_38,0x68);
    Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_50,0x1ec);
    Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_48,0x1eb);
    in_value = Am_Object::Get(&local_40,0x169,0);
    Am_Value::operator=((Am_Value *)self,in_value);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_50);
  }
  else {
    Am_Value::Am_Value(&local_60,&value_from_text_part_proc::val);
    Am_Value::operator=((Am_Value *)self,&local_60);
    Am_Value::~Am_Value(&local_60);
  }
  Am_Object::~Am_Object(&local_38);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, value_from_text_part)
{
  Am_Value value;
  static Am_String val("");

  Am_Object owner = self.Get_Owner();
  if (owner.Valid())
    value = owner.Get_Object(Am_WINDOW)
                .Get_Object(Am_DIALOG_GROUP)
                .Get_Object(Am_TEXT_WIDGET)
                .Get(Am_VALUE);
  else
    value = Am_Value(val);
  return value;
}